

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Protector.cpp
# Opt level: O0

Message * __thiscall
CppUnit::Protector::actualMessage
          (Message *__return_storage_ptr__,Protector *this,Message *message,
          ProtectorContext *context)

{
  ulong uVar1;
  string *shortDescription;
  string *detail1;
  Message local_b8;
  undefined1 local_29;
  ProtectorContext *local_28;
  ProtectorContext *context_local;
  Message *message_local;
  Protector *this_local;
  Message *theActualMessage;
  
  local_29 = 0;
  local_28 = context;
  context_local = (ProtectorContext *)message;
  message_local = (Message *)this;
  this_local = (Protector *)__return_storage_ptr__;
  Message::Message(__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    shortDescription = &local_28->m_shortDescription;
    detail1 = Message::shortDescription_abi_cxx11_((Message *)context_local);
    Message::Message(&local_b8,shortDescription,detail1);
    Message::operator=(__return_storage_ptr__,&local_b8);
    Message::~Message(&local_b8);
    Message::addDetail(__return_storage_ptr__,(Message *)context_local);
  }
  else {
    Message::operator=(__return_storage_ptr__,(Message *)context_local);
  }
  return __return_storage_ptr__;
}

Assistant:

Message 
Protector::actualMessage( const Message &message,
                          const ProtectorContext &context ) const
{
  Message theActualMessage;
  if ( context.m_shortDescription.empty() )
    theActualMessage = message;
  else
  {
    theActualMessage = Message( context.m_shortDescription, 
                                message.shortDescription() );
    theActualMessage.addDetail( message );
  }

  return theActualMessage;
}